

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall
imrt::Plan::Plan(Plan *this,vector<double,_std::allocator<double>_> *w,
                vector<double,_std::allocator<double>_> *Zmin,
                vector<double,_std::allocator<double>_> *Zmax,Collimator *collimator,
                vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
                int max_intensity,int initial_intensity,int step_intensity,int open_apertures,
                int setup,char *file)

{
  int iVar1;
  pair<int,_int> pVar2;
  ostream *poVar3;
  mapped_type pSVar4;
  mapped_type *ppSVar5;
  size_type sVar6;
  undefined8 in_RCX;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_RDX;
  undefined8 unaff_RBP;
  Collimator *in_RSI;
  Station *in_RDI;
  Collimator *in_R8;
  undefined8 unaff_R14;
  int unaff_retaddr;
  int in_stack_00000008;
  fstream *in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  char *in_stack_00000038;
  Station *station;
  int i;
  fstream *myfile;
  undefined4 uVar7;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  key_type_conflict *in_stack_fffffffffffffea8;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *in_stack_fffffffffffffeb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  int local_64;
  fstream *local_60;
  Station *this_00;
  
  in_RDI->_vptr_Station = (_func_int **)&PTR__Plan_0017fc48;
  this_00 = in_RDI;
  std::
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  ::map((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
         *)0x159720);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x159739);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x159752);
  pVar2 = (pair<int,_int>)
          EvaluationFunction::getInstance
                    ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (Collimator *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  (in_RDI->last_mem).second = pVar2;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar3 = std::operator<<((ostream *)&std::cout,"##Initilizing plan.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_60 = (fstream *)0x0;
  if (in_stack_00000038 != (char *)0x0) {
    local_60 = (fstream *)operator_new(0x210);
    std::fstream::fstream(local_60,in_stack_00000038,_S_in);
  }
  for (local_64 = 0; iVar1 = Collimator::getNbAngles(in_R8), local_64 < iVar1;
      local_64 = local_64 + 1) {
    pSVar4 = (mapped_type)operator_new(0x170);
    Collimator::getAngle
              ((Collimator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe6c);
    uVar7 = in_stack_00000018;
    in_stack_fffffffffffffe70 = in_stack_00000020;
    Station::Station(this_00,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     (int)((ulong)in_R8 >> 0x20),(int)unaff_R14,(int)unaff_RBP,unaff_retaddr,
                     in_stack_00000008,in_stack_00000010);
    add_station((Plan *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                (Station *)CONCAT44(in_stack_fffffffffffffe6c,uVar7));
    Collimator::getAngle
              ((Collimator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe6c);
    ppSVar5 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *ppSVar5 = pSVar4;
  }
  if ((local_60 != (fstream *)0x0) && (std::fstream::close(), local_60 != (fstream *)0x0)) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"##  Created ");
  sVar6 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
                    ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
  poVar3 = std::operator<<(poVar3," stations.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  eval((Plan *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  poVar3 = std::operator<<((ostream *)&std::cout,"##  Initial evaluation: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)(in_RDI->intensity).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start);
  poVar3 = std::operator<<(poVar3,".");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  (in_RDI->A).
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Plan::Plan(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& collimator,
             vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
             int step_intensity, int open_apertures, int setup, char* file) :
             ev(EvaluationFunction::getInstance(volumes, collimator)), w(w), Zmin(Zmin), Zmax(Zmax) {

    cout << "##Initilizing plan."<< endl;


    fstream* myfile=NULL;
    if(file) myfile=new fstream(file, std::ios_base::in);

    for (int i=0;i<collimator.getNbAngles();i++) {
      Station* station = new Station(collimator, volumes, collimator.getAngle(i), max_apertures,
                                     max_intensity, initial_intensity, step_intensity, open_apertures, setup, myfile);
      add_station(*station);
      angle2station[collimator.getAngle(i)]=station;
    }
    if(myfile){
    	myfile->close();
        delete myfile;
    }
    cout << "##  Created " << stations.size() << " stations."<< endl;
    eval();
    cout << "##  Initial evaluation: " << evaluation_fx << "."<< endl;
    last_changed=NULL;

    //ev.create_beam2voxel_list(*this);
  }